

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O0

int testDcmBiasEstimator(int errorCode)

{
  allocator<double> *this;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  Matrix<double,_1,1,0,_1,1> *pMVar7;
  StorageBaseType *pSVar8;
  reference pvVar9;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pMVar10;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar11;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEVar12;
  ostream *poVar13;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar14;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar15;
  void *this_01;
  value_type vVar16;
  RealScalar RVar17;
  RealScalar RVar18;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1618;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1600;
  int local_15e4;
  double dStack_15e0;
  int i_4;
  double error;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_15d0;
  int local_15ac;
  undefined1 local_15a8 [8];
  Vector log_k;
  non_const_type local_1590;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_1588 [16];
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_1578 [16];
  Vector2 local_1568;
  Vector2 local_1558;
  Vector2 local_1548;
  int local_1534;
  undefined1 local_1530 [4];
  int i_3;
  IndexedVectorArray log;
  Vector2 local_14c8;
  Vector2 local_14b8;
  Vector2 local_14a8;
  ConstantReturnType local_1498;
  Matrix<double,2,1,0,2,1> local_1488 [16];
  ConstantReturnType local_1478;
  Matrix<double,2,1,0,2,1> local_1468 [16];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1458 [16];
  Matrix<double,2,1,0,2,1> local_1448 [16];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1438 [16];
  Matrix<double,2,1,0,2,1> local_1428 [16];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_1418 [16];
  Matrix<double,2,1,0,2,1> local_1408 [16];
  ConstantReturnType local_13f8;
  Matrix<double,2,1,0,2,1> local_13e8 [16];
  LipmDcmEstimator local_13d8 [8];
  LipmDcmEstimator est;
  double local_e98;
  double local_e90;
  undefined1 local_e88 [8];
  Vector2 initbias;
  undefined1 local_e70 [8];
  IndexedVectorArray bias_hat;
  IndexedVectorArray dcm_hat;
  Matrix<double,_2,_2,_0,_2,_2> local_db8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_d98 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_d88;
  ProbabilityLawSimulation local_d78 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_d68;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_d48;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_d18;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_cfb [3];
  Matrix<double,_2,_2,_0,_2,_2> local_cf8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_cd8 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_cc8;
  ProbabilityLawSimulation local_cb8 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_ca0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_c80;
  int local_c4c;
  undefined1 local_c48 [4];
  int i_2;
  IndexedVectorArray zmp_m;
  IndexedVectorArray dcm_m;
  IndexedVectorArray dcm_m_unbiased;
  RotationBase<Eigen::Rotation2D<double>,2> local_b38 [28];
  int local_b1c;
  double dStack_b18;
  int i_1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_b0b [3];
  Matrix<double,_2,_2,_0,_2,_2> local_b08;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_ae8 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_ad8;
  ProbabilityLawSimulation local_ac8 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_ab8;
  double local_a98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a90;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a60;
  double local_a18;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a10;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_9a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_900;
  double local_848;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_83b [3];
  Matrix<double,_2,_2,_0,_2,_2> local_838;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_818 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_808;
  ProbabilityLawSimulation local_7f8 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_7e0;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_7bb [3];
  Matrix<double,_2,_2,_0,_2,_2> local_7b8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_798 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_788;
  ProbabilityLawSimulation local_778 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_760;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_740;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
  local_700;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_6b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_680;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_640;
  double local_5e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_5e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_560;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_4cb [3];
  Matrix<double,_2,_2,_0,_2,_2> local_4c8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_4a8 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_498;
  ProbabilityLawSimulation local_488 [28];
  int local_46c;
  double dStack_468;
  int i;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_460;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_430;
  double local_3e8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_3db [3];
  Matrix<double,_2,_2,_0,_2,_2> local_3d8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_3b8 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_3a8;
  ProbabilityLawSimulation local_398 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_388;
  Matrix<double,2,1,0,2,1> local_368 [8];
  Vector2 deviation;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_34b [3];
  Matrix<double,_2,_2,_0,_2,_2> local_348;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_328 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_318;
  ProbabilityLawSimulation local_308 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_2f8;
  Scalar local_2d8;
  double initBiasstd;
  Matrix<double,_2,_2,_0,_2,_2> local_2c8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_2a8 [16];
  Matrix<double,_2,_1,_0,_2,_1> local_298;
  ProbabilityLawSimulation local_288 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_270;
  double local_250;
  double lambda;
  undefined1 local_240 [8];
  vector<double,_std::allocator<double>_> kappa;
  undefined1 local_220 [8];
  vector<double,_std::allocator<double>_> yaw;
  IndexedVectorArray gamma;
  IndexedVectorArray zmp;
  IndexedVectorArray bias;
  undefined1 local_f0 [8];
  IndexedVectorArray localBias;
  IndexedVectorArray dcm;
  double dStack_38;
  int signallength;
  double dcmMeasurementErrorStd;
  double zmpMeasurementErrorStd;
  double biasDriftPerSecondStd;
  double dt;
  double w0;
  int errorCode_local;
  
  w0._0_4_ = errorCode;
  dt = sqrt(10.88888888888889);
  biasDriftPerSecondStd = 0.005;
  zmpMeasurementErrorStd = 0.005;
  dcmMeasurementErrorStd = 0.001;
  dStack_38 = 0.005;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&localBias.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_f0,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&zmp.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&gamma.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,24000,0);
  this = (allocator<double> *)
         ((long)&kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_220,24000,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&kappa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<double>::allocator((allocator<double> *)((long)&lambda + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_240,24000,
             (allocator<double> *)((long)&lambda + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&lambda + 7));
  local_250 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)&local_298,local_2a8);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::Matrix<double,2,2,0,2,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((Matrix<double,2,2,0,2,2> *)&local_2c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)((long)&initBiasstd + 5));
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            (local_288,&local_298,&local_2c8,2,1);
  initBiasstd._0_4_ = 4;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            (&local_270,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_288,(int *)&initBiasstd
            );
  pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&localBias.v_.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                     *)&local_270);
  local_2d8 = 0.01;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)&local_318,local_328);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::Matrix<double,2,2,0,2,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((Matrix<double,2,2,0,2,2> *)&local_348,local_34b);
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            (local_308,&local_318,&local_348,2,1);
  deviation.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.01;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            (&local_2f8,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_308,
             deviation.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
             .array + 1);
  pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_f0,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                     *)&local_2f8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)&local_3a8,local_3b8);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::Matrix<double,2,2,0,2,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((Matrix<double,2,2,0,2,2> *)&local_3d8,local_3db);
  stateObservation::tools::ProbabilityLawSimulation::
  getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
            (local_398,&local_3a8,&local_3d8,2,1);
  local_3e8 = 0.05;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
            (&local_388,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_398,&local_3e8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
            (local_368,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&local_388);
  dStack_468 = local_250 / dt + 1.0;
  pSVar8 = (StorageBaseType *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&localBias.v_.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  Eigen::operator*(&local_460,&stack0xfffffffffffffb98,pSVar8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+(&local_430,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_460,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_368);
  pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
           stateObservation::
           IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&gamma.v_.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     *)&local_430);
  for (local_46c = 0; local_46c < 23999; local_46c = local_46c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_498,local_4a8);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_4c8,local_4cb);
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_488,&local_498,&local_4c8,2,1);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)local_46c);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_488);
    vVar16 = (value_type)
             stateObservation::tools::ProbabilityLawSimulation::getUniformScalar(0.5,1.5);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_240,(long)local_46c);
    *pvVar9 = vVar16;
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&localBias.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_46c);
    local_5e8 = biasDriftPerSecondStd * dt;
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&localBias.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_46c);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_240,(long)local_46c);
    pSVar8 = (StorageBaseType *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&gamma.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_46c);
    Eigen::operator*(&local_6b0,pvVar9,pSVar8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_680,this_00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_6b0);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_46c);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(&local_640,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_680,pMVar11);
    Eigen::operator*(&local_5e0,&local_5e8,(StorageBaseType *)&local_640);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_560,pMVar10,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_5e0);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&localBias.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                          (long)(local_46c + 1));
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                       *)&local_560);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_f0,(long)local_46c);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_788,local_798);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_7b8,local_7bb);
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_778,&local_788,&local_7b8,2,1);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              (&local_760,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_778,
               &zmpMeasurementErrorStd);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
    ::operator*(&local_740,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>>
                 *)&local_760,&biasDriftPerSecondStd);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_700,pMVar10,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&local_740);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_f0,(long)(local_46c + 1));
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                       *)&local_700);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_808,local_818);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_838,local_83b);
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_7f8,&local_808,&local_838,2,1);
    local_848 = 0.05;
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              (&local_7e0,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_7f8,&local_848);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_368,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&local_7e0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_240,(long)local_46c);
    local_a18 = 1.0 / *pvVar9;
    local_a98 = local_250 / dt + 1.0;
    pSVar8 = (StorageBaseType *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&localBias.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_46c);
    Eigen::operator*(&local_a90,&local_a98,pSVar8);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_46c);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator+(&local_a60,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_a90,pMVar11);
    Eigen::operator*(&local_a10,&local_a18,(StorageBaseType *)&local_a60);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_ad8,local_ae8);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_b08,local_b0b);
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_ac8,&local_ad8,&local_b08,2,1);
    dStack_b18 = 0.05;
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              (&local_ab8,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_ac8,
               &stack0xfffffffffffff4e8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(&local_9a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_a10,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                 *)&local_ab8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
    ::operator+(&local_900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const>const>>
                 *)&local_9a0,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_368);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&gamma.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                          (long)(local_46c + 1));
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                       *)&local_900);
  }
  for (local_b1c = 0; local_b1c < 24000; local_b1c = local_b1c + 1) {
    vVar16 = (value_type)
             stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                       (6.283185307179586,0.0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_220,(long)local_b1c);
    *pvVar9 = vVar16;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_220,(long)local_b1c);
    Eigen::Rotation2D<double>::Rotation2D
              ((Rotation2D<double> *)
               &dcm_m_unbiased.v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,pvVar9);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_f0,(long)local_b1c);
    Eigen::RotationBase<Eigen::Rotation2D<double>,2>::operator*
              (local_b38,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &dcm_m_unbiased.v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&zmp.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_b1c);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_b38);
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&dcm_m.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&zmp_m.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_c48,24000,0);
  for (local_c4c = 0; local_c4c < 24000; local_c4c = local_c4c + 1) {
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&localBias.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_cc8,local_cd8);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_cf8,local_cfb);
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_cb8,&local_cc8,&local_cf8,2,1);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              (&local_ca0,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_cb8,
               &stack0xffffffffffffffc8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_c80,pMVar10,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&local_ca0);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&dcm_m.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                       *)&local_c80);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&dcm_m.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&zmp.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+(&local_d18,pMVar10,pMVar11);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&zmp_m.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)&local_d18);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&gamma.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_c4c);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_d88,local_d98);
    Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
    Eigen::Matrix<double,2,2,0,2,2>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
              ((Matrix<double,2,2,0,2,2> *)&local_db8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                *)((long)&dcm_hat.v_.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node + 5));
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
              (local_d78,&local_d88,&local_db8,2,1);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator*
              (&local_d68,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_d78,
               &dcmMeasurementErrorStd);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_d48,pMVar10,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                *)&local_d68);
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_c48,(long)local_c4c);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (pMVar7,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                       *)&local_d48);
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&bias_hat.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,24000,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_e70,24000,0);
  local_e90 = 0.0;
  local_e98 = 0.0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)local_e88,&local_e90,&local_e98);
  dVar5 = dt;
  dVar4 = biasDriftPerSecondStd;
  dVar3 = zmpMeasurementErrorStd;
  dVar2 = dcmMeasurementErrorStd;
  dVar1 = dStack_38;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            (&local_13f8,(Scalar *)&stateObservation::LipmDcmEstimator::defaultBiasLimit);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_13e8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_13f8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_1408,local_1418);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_1428,local_1438);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_1448,local_1458);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            (&local_1478,(Scalar *)&stateObservation::LipmDcmEstimator::defaultDCMUncertainty);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_1468,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_1478);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            (&local_1498,(Scalar *)&stateObservation::LipmDcmEstimator::defaultBiasUncertainty);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            (local_1488,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_1498);
  stateObservation::LipmDcmEstimator::LipmDcmEstimator
            (local_13d8,dVar4,dVar5,dVar3,dVar1,dVar2,(Matrix *)local_13e8,(Matrix *)local_1408,
             (Matrix *)local_1428,(Matrix *)local_1448,(Matrix *)local_1468,(Matrix *)local_1488);
  pEVar12 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&zmp_m.v_.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node,0);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,2,1,0,2,1> *)&local_14a8,pEVar12);
  pEVar12 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_c48,0);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,2,1,0,2,1> *)&local_14b8,pEVar12);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_220,0);
  dVar1 = *pvVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
            ((ConstantReturnType *)
             &log.v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_2d8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)&local_14c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&log.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::LipmDcmEstimator::resetWithMeasurements
            (local_13d8,&local_14a8,&local_14b8,dVar1,true,(Vector2 *)local_e88,&local_14c8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_1530);
  local_1534 = 1;
  do {
    if (23999 < local_1534) {
      dStack_15e0 = 0.0;
      for (local_15e4 = 0x5db6; local_15e4 < 24000; local_15e4 = local_15e4 + 1) {
        pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&bias_hat.v_.
                                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
                               (long)local_15e4);
        pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&localBias.v_.
                                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
                               (long)local_15e4);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(&local_1600,pMVar10,pMVar11)
        ;
        RVar17 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_1600);
        pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)local_e70,(long)local_15e4);
        pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  stateObservation::
                  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&zmp.v_.
                                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
                               (long)local_15e4);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(&local_1618,pMVar10,pMVar11)
        ;
        RVar18 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_1618);
        dStack_15e0 = RVar17 + RVar18 + dStack_15e0;
      }
      poVar13 = std::operator<<((ostream *)&std::cout,"Sum of error on the 10 last samples = ");
      this_01 = (void *)std::ostream::operator<<(poVar13,dStack_15e0);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      if (dStack_15e0 <= 0.07) {
        w0._4_4_ = 0;
      }
      else {
        w0._4_4_ = w0._0_4_;
      }
LAB_00106de5:
      log_k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           1;
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_1530);
      stateObservation::LipmDcmEstimator::~LipmDcmEstimator(local_13d8);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_e70);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&bias_hat.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_c48);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&zmp_m.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&dcm_m.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_240);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_220);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&gamma.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&zmp.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_f0);
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~IndexedMatrixArrayT
                ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&localBias.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      return w0._4_4_;
    }
    pEVar12 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&zmp_m.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,2,1,0,2,1> *)&local_1548,pEVar12);
    pEVar12 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_c48,(long)local_1534);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,2,1,0,2,1> *)&local_1558,pEVar12);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_220,(long)local_1534);
    dVar1 = *pvVar9;
    pEVar12 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&yaw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)(local_1534 + -1));
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,2,1,0,2,1> *)&local_1568,pEVar12);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_240,(long)(local_1534 + -1)
                       );
    stateObservation::LipmDcmEstimator::setInputs
              (local_13d8,&local_1548,&local_1558,dVar1,&local_1568,*pvVar9);
    stateObservation::LipmDcmEstimator::update();
    stateObservation::LipmDcmEstimator::getBias();
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_e70,(long)local_1534);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=(pMVar7,local_1578);
    stateObservation::LipmDcmEstimator::getUnbiasedDCM();
    pMVar7 = (Matrix<double,_1,1,0,_1,1> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&bias_hat.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=(pMVar7,local_1588);
    pMVar10 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&bias_hat.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&bias_hat.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator!=(pMVar10,pMVar11);
    if (bVar6) {
      poVar13 = std::operator<<((ostream *)&std::cout,"NaN detected = ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1534);
      poVar13 = std::operator<<(poVar13," ");
      pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                stateObservation::
                IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&bias_hat.v_.
                                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534)
      ;
      local_1590 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar14);
      poVar13 = Eigen::operator<<(poVar13,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_1590);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      w0._4_4_ = w0._0_4_;
      goto LAB_00106de5;
    }
    local_15ac = 0xb;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_15a8,&local_15ac);
    error = (double)local_1534;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_15d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_15a8,&error);
    pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_e70,(long)local_1534);
    pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_15d0,pDVar14)
    ;
    pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_f0,(long)local_1534);
    pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar15,pDVar14);
    pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&bias_hat.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar15,pDVar14);
    pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&dcm_m.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar15,pDVar14);
    pDVar14 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&localBias.v_.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)local_1534);
    Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar15,pDVar14);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_15d0)
    ;
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pushBack((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_1530,(Matrix<double,__1,_1,_0,__1,_1> *)local_15a8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_15a8);
    local_1534 = local_1534 + 1;
  } while( true );
}

Assistant:

int testDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  IndexedVectorArray dcm(signallength), localBias(signallength), bias(signallength), zmp(signallength),
      gamma(signallength);
  std::vector<double> yaw(signallength), kappa(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and localBias to a random value
  dcm[0] = ran::getGaussianMatrix<Vector2>() * 4;
  double initBiasstd = 0.01;

  localBias[0] = ran::getGaussianMatrix<Vector2>() * 0.01;
  Vector2 deviation = ran::getGaussianMatrix<Vector2>() * 0.05;
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    gamma[i] = ran::getGaussianMatrix<Vector2>();
    kappa[i] = ran::getUniformScalar(0.5, 1.5);
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - kappa[i] * zmp[i] + gamma[i]);
    /// local bias drift
    localBias[i + 1] = localBias[i] + ran::getGaussianMatrix<Vector2>() * biasDriftPerSecondStd * dt;
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianMatrix<Vector2>() * 0.05;
    zmp[i + 1] = (1. / kappa[i]) * ((lambda / w0 + 1) * dcm[i] + gamma[i]) + ran::getGaussianMatrix<Vector2>() * 0.05
                 + deviation;
  }

  for(int i = 0; i < signallength; ++i)
  {
    /// global-frame bias computation
    yaw[i] = ran::getGaussianScalar(2 * M_PI);
    bias[i] = Rotation2D(yaw[i]) * localBias[i];
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  IndexedVectorArray dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {

    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianMatrix<Vector2>() * dcmMeasurementErrorStd;
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianMatrix<Vector2>() * zmpMeasurementErrorStd;
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  IndexedVectorArray dcm_hat(signallength), bias_hat(signallength);

  Vector2 initbias{0.0, 0.0};

  LipmDcmEstimator est(dt, w0, biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd);

  est.resetWithMeasurements(dcm_m[0], zmp_m[0], yaw[0], true, initbias, Vector2::Constant(initBiasstd));

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i], yaw[i], gamma[i - 1], kappa[i - 1]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      std::cout << "NaN detected = " << i << " " << dcm_hat[i].transpose() << std::endl;
      return errorCode;
    }

    Vector log_k(11);

    log_k << i, bias_hat[i], localBias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the error
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += (dcm_hat[i] - dcm[i]).norm() + (bias_hat[i] - bias[i]).norm();
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}